

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

double gmlc::utilities::strViewToFloat<double>(string_view input,size_t *charactersUsed)

{
  const_pointer pvVar1;
  const_pointer pvVar2;
  size_type sVar3;
  out_of_range *this;
  invalid_argument *this_00;
  long *in_RDX;
  undefined1 auVar4 [12];
  from_chars_result conversionResult;
  double val;
  double local_20;
  long *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20 = 0.0;
  if (in_RDX != (long *)0x0) {
    *in_RDX = 0;
  }
  local_18 = in_RDX;
  pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  sVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  auVar4 = std::from_chars(pvVar1,pvVar2 + sVar3,&local_20,3);
  if (auVar4._8_4_ == 0) {
    if (local_18 != (long *)0x0) {
      pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      *local_18 = auVar4._0_8_ - (long)pvVar1;
    }
    return local_20;
  }
  if (auVar4._8_4_ == 0x22) {
    if (local_18 != (long *)0x0) {
      pvVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      *local_18 = auVar4._0_8_ - (long)pvVar1;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"conversion type does not support the string conversion");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"unable to convert string");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

X strViewToFloat(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(
        std::is_floating_point_v<X>, "requested type is not floating point");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc{}) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    throw(std::invalid_argument("unable to convert string"));
}